

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkeletonWriter.cpp
# Opt level: O2

void __thiscall adios2::core::engine::SkeletonWriter::InitParameters(SkeletonWriter *this)

{
  IO *pIVar1;
  _Alloc_hider _Var2;
  size_type sVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  _Base_ptr p_Var7;
  size_type sVar8;
  allocator local_104;
  allocator local_103;
  allocator local_102;
  allocator local_101;
  SkeletonWriter *local_100;
  _Rb_tree_node_base *local_f8;
  string value;
  string key;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  pIVar1 = (this->super_Engine).m_IO;
  local_f8 = &(pIVar1->m_Parameters)._M_t._M_impl.super__Rb_tree_header._M_header;
  local_100 = this;
  for (p_Var7 = (pIVar1->m_Parameters)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var7 != local_f8; p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7)) {
    std::__cxx11::string::string((string *)&key,(string *)(p_Var7 + 1));
    sVar3 = key._M_string_length;
    _Var2 = key._M_dataplus;
    for (sVar8 = 0; sVar3 != sVar8; sVar8 = sVar8 + 1) {
      iVar5 = tolower((int)_Var2._M_p[sVar8]);
      _Var2._M_p[sVar8] = (char)iVar5;
    }
    std::__cxx11::string::string((string *)&value,(string *)(p_Var7 + 2));
    sVar3 = value._M_string_length;
    _Var2 = value._M_dataplus;
    for (sVar8 = 0; sVar3 != sVar8; sVar8 = sVar8 + 1) {
      iVar5 = tolower((int)_Var2._M_p[sVar8]);
      _Var2._M_p[sVar8] = (char)iVar5;
    }
    bVar4 = std::operator==(&key,"verbose");
    if (bVar4) {
      uVar6 = std::__cxx11::stoi(&value,(size_t *)0x0,10);
      local_100->m_Verbosity = uVar6;
      if (5 < uVar6) {
        std::__cxx11::string::string((string *)&local_50,"Engine",&local_101);
        std::__cxx11::string::string((string *)&local_70,"SkeletonWriter",&local_102);
        std::__cxx11::string::string((string *)&local_90,"InitParameters",&local_103);
        std::__cxx11::string::string
                  ((string *)&local_b0,
                   "Method verbose argument must be an integer in the range [0,5], in call to Open or Engine constructor"
                   ,&local_104);
        helper::Throw<std::invalid_argument>(&local_50,&local_70,&local_90,&local_b0,-1);
        std::__cxx11::string::~string((string *)&local_b0);
        std::__cxx11::string::~string((string *)&local_90);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_50);
      }
    }
    std::__cxx11::string::~string((string *)&value);
    std::__cxx11::string::~string((string *)&key);
  }
  return;
}

Assistant:

void SkeletonWriter::InitParameters()
{
    for (const auto &pair : m_IO.m_Parameters)
    {
        std::string key(pair.first);
        std::transform(key.begin(), key.end(), key.begin(), ::tolower);

        std::string value(pair.second);
        std::transform(value.begin(), value.end(), value.begin(), ::tolower);

        if (key == "verbose")
        {
            m_Verbosity = std::stoi(value);
            if (m_Verbosity < 0 || m_Verbosity > 5)
                helper::Throw<std::invalid_argument>("Engine", "SkeletonWriter", "InitParameters",
                                                     "Method verbose argument must be an "
                                                     "integer in the range [0,5], in call to "
                                                     "Open or Engine constructor");
        }
    }
}